

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.cpp
# Opt level: O2

int __thiscall CaDiCaL::Internal::trivially_true_satisfiable(Internal *this)

{
  anon_struct_16_2_20cb3f79_for_constant_forward_backward *paVar1;
  pointer ppCVar2;
  Clause *pCVar3;
  bool bVar4;
  Clause *__range2;
  int iVar5;
  long lVar6;
  int idx;
  int lit;
  pointer ppCVar7;
  
  ppCVar2 = (this->clauses).
            super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar7 = (this->clauses).
                 super__Vector_base<CaDiCaL::Clause_*,_std::allocator<CaDiCaL::Clause_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar7 != ppCVar2; ppCVar7 = ppCVar7 + 1) {
    bVar4 = terminated_asynchronously(this,100);
    if (bVar4) goto LAB_006652e2;
    pCVar3 = *ppCVar7;
    if ((*(ushort *)&pCVar3->field_0x8 & 0x810) == 0) {
      lVar6 = 0;
      do {
        if ((long)pCVar3->size * 4 == lVar6) goto LAB_006652d9;
        iVar5 = *(int *)((long)&pCVar3[1].field_0 + lVar6);
      } while ((this->vals[iVar5] < '\x01') &&
              (lVar6 = lVar6 + 4, iVar5 < 0 || this->vals[iVar5] != '\0'));
    }
  }
  if (this->internal != (Internal *)0x0) {
    verbose(this->internal,1,"all clauses contain a positive literal");
  }
  lit = 1;
  iVar5 = *(this->vars).n;
  while( true ) {
    if (lit - iVar5 == 1) {
      paVar1 = &(this->stats).lucky.constant;
      paVar1->one = paVar1->one + 1;
      return 10;
    }
    bVar4 = terminated_asynchronously(this,10);
    if (bVar4) break;
    if (this->vals[lit] == '\0') {
      search_assume_decision(this,lit);
      bVar4 = propagate(this);
      if (!bVar4) goto LAB_006652d9;
    }
    lit = lit + 1;
  }
LAB_006652e2:
  iVar5 = -1;
LAB_006652ea:
  unlucky(this,iVar5);
  return iVar5;
LAB_006652d9:
  iVar5 = 0;
  goto LAB_006652ea;
}

Assistant:

int Internal::trivially_true_satisfiable () {
  LOG ("checking that all clauses contain a positive literal");
  assert (!level);
  assert (assumptions.empty ());
  for (const auto &c : clauses) {
    if (terminated_asynchronously (100))
      return unlucky (-1);
    if (c->garbage)
      continue;
    if (c->redundant)
      continue;
    bool satisfied = false, found_positive_literal = false;
    for (const auto &lit : *c) {
      const signed char tmp = val (lit);
      if (tmp > 0) {
        satisfied = true;
        break;
      }
      if (tmp < 0)
        continue;
      if (lit < 0)
        continue;
      found_positive_literal = true;
      break;
    }
    if (satisfied || found_positive_literal)
      continue;
    LOG (c, "found purely negatively");
    return unlucky (0);
  }
  VERBOSE (1, "all clauses contain a positive literal");
  for (auto idx : vars) {
    if (terminated_asynchronously (10))
      return unlucky (-1);
    if (val (idx))
      continue;
    search_assume_decision (idx);
    if (propagate ())
      continue;
    assert (level > 0);
    LOG ("propagation failed including redundant clauses");
    return unlucky (0);
  }
  stats.lucky.constant.one++;
  return 10;
}